

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3HasExplicitNulls(Parse *pParse,ExprList *pList)

{
  char *pcVar1;
  int *in_RSI;
  Parse *in_RDI;
  u8 sf;
  int i;
  int local_1c;
  
  if (in_RSI != (int *)0x0) {
    for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
      if ((*(ushort *)((long)in_RSI + (long)local_1c * 0x18 + 0x19) >> 5 & 1) != 0) {
        pcVar1 = "LAST";
        if ((char)in_RSI[(long)local_1c * 6 + 6] == '\0' ||
            (char)in_RSI[(long)local_1c * 6 + 6] == '\x03') {
          pcVar1 = "FIRST";
        }
        sqlite3ErrorMsg(in_RDI,"unsupported use of NULLS %s",pcVar1);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3HasExplicitNulls(Parse *pParse, ExprList *pList){
  if( pList ){
    int i;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].fg.bNulls ){
        u8 sf = pList->a[i].fg.sortFlags;
        sqlite3ErrorMsg(pParse, "unsupported use of NULLS %s",
            (sf==0 || sf==3) ? "FIRST" : "LAST"
        );
        return 1;
      }
    }
  }
  return 0;
}